

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetComponentQName(xmlChar **buf,void *item)

{
  xmlChar *pxVar1;
  xmlChar *localName;
  void *item_local;
  xmlChar **buf_local;
  
  pxVar1 = xmlSchemaGetComponentTargetNs((xmlSchemaBasicItemPtr)item);
  localName = xmlSchemaGetComponentName((xmlSchemaBasicItemPtr)item);
  pxVar1 = xmlSchemaFormatQName(buf,pxVar1,localName);
  return pxVar1;
}

Assistant:

static const xmlChar*
xmlSchemaGetComponentQName(xmlChar **buf,
			   void *item)
{
    return (xmlSchemaFormatQName(buf,
	xmlSchemaGetComponentTargetNs((xmlSchemaBasicItemPtr) item),
	xmlSchemaGetComponentName((xmlSchemaBasicItemPtr) item)));
}